

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O2

magic_realm * class_magic_realms(player_class *c,int *count)

{
  magic_realm **ppmVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 uVar6;
  int iVar7;
  magic_realm *p;
  magic_realm *pmVar8;
  magic_realm *pmVar9;
  bool bVar10;
  long lVar11;
  
  p = (magic_realm *)mem_zalloc(0x38);
  *count = 0;
  if ((c->magic).total_spells == L'\0') {
    mem_free(p);
    p = (magic_realm *)0x0;
  }
  else {
    for (lVar11 = 0; lVar11 < (c->magic).num_books; lVar11 = lVar11 + 1) {
      ppmVar1 = &(c->magic).books[lVar11].realm;
      if (p->name == (char *)0x0) {
        pmVar9 = *ppmVar1;
        pcVar2 = pmVar9->code;
        pcVar3 = pmVar9->name;
        iVar7 = pmVar9->stat;
        uVar6 = *(undefined4 *)&pmVar9->field_0x1c;
        pcVar4 = pmVar9->verb;
        pcVar5 = pmVar9->spell_noun;
        p->next = pmVar9->next;
        p->code = pcVar2;
        p->book_noun = pmVar9->book_noun;
        p->verb = pcVar4;
        p->spell_noun = pcVar5;
        p->name = pcVar3;
        p->stat = iVar7;
        *(undefined4 *)&p->field_0x1c = uVar6;
        p->next = (magic_realm *)0x0;
LAB_0019e661:
        *count = *count + 1;
      }
      else {
        bVar10 = false;
        for (pmVar9 = p; pmVar9 != (magic_realm *)0x0; pmVar9 = pmVar9->next) {
          iVar7 = strcmp(pmVar9->name,(*ppmVar1)->name);
          bVar10 = (bool)(bVar10 | iVar7 == 0);
        }
        if (!bVar10) {
          pmVar8 = (magic_realm *)mem_zalloc(0x38);
          pmVar9 = *ppmVar1;
          pcVar2 = pmVar9->code;
          pcVar3 = pmVar9->name;
          iVar7 = pmVar9->stat;
          uVar6 = *(undefined4 *)&pmVar9->field_0x1c;
          pcVar4 = pmVar9->verb;
          pcVar5 = pmVar9->spell_noun;
          pmVar8->next = pmVar9->next;
          pmVar8->code = pcVar2;
          pmVar8->name = pcVar3;
          pmVar8->stat = iVar7;
          *(undefined4 *)&pmVar8->field_0x1c = uVar6;
          pmVar8->verb = pcVar4;
          pmVar8->spell_noun = pcVar5;
          pmVar8->book_noun = pmVar9->book_noun;
          pmVar8->next = p;
          p = pmVar8;
          goto LAB_0019e661;
        }
      }
    }
  }
  return p;
}

Assistant:

struct magic_realm *class_magic_realms(const struct player_class *c, int *count)
{
	int i;
	struct magic_realm *r = mem_zalloc(sizeof(struct magic_realm));

	*count = 0;

	if (!c->magic.total_spells) {
		mem_free(r);
		return NULL;
	}

	for (i = 0; i < c->magic.num_books; i++) {
		struct magic_realm *r_test = r;
		struct class_book *book = &c->magic.books[i];
		bool found = false;

		/* Test for first realm */
		if (r->name == NULL) {
			memcpy(r, book->realm, sizeof(struct magic_realm));
			r->next = NULL;
			(*count)++;
			continue;
		}

		/* Test for already recorded */
		while (r_test) {
			if (streq(r_test->name, book->realm->name)) {
				found = true;
			}
			r_test = r_test->next;
		}
		if (found) continue;

		/* Add it */
		r_test = mem_zalloc(sizeof(struct magic_realm));
		memcpy(r_test, book->realm, sizeof(struct magic_realm));
		r_test->next = r;
		r = r_test;
		(*count)++;
	}

	return r;
}